

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (detail *this,basic_appender<char> out,unsigned___int128 value,uint prefix,
          format_specs *specs,digit_grouping<char> *grouping)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 n [16];
  undefined1 value_00 [16];
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  byte *pbVar8;
  basic_appender<char> bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  undefined4 in_register_00000014;
  int iVar15;
  char cVar16;
  undefined8 *in_R9;
  size_t sVar17;
  size_t size;
  bool bVar18;
  bool bVar19;
  memory_buffer buffer;
  undefined1 in_stack_fffffffffffffd18 [12];
  anon_class_24_3_e2c60416 local_2c8 [5];
  memory_buffer local_248;
  
  uVar13 = CONCAT44(in_register_00000014,prefix);
  uVar11 = (uint)specs;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar10 = *(uint *)&(grouping->grouping_)._M_dataplus._M_p;
  switch(uVar10 & 7) {
  case 4:
    if ((uVar10 >> 0xd & 1) != 0) {
      uVar4 = (uint)((uVar10 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar5 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar5 = uVar4;
      }
      uVar11 = (uVar5 | uVar11) + 0x2000000;
    }
    uVar12 = uVar13;
    bVar9.container = out.container;
    size = 0;
    do {
      sVar17 = size;
      uVar1 = uVar12 << 0x3c;
      size = sVar17 + 1;
      bVar18 = (buffer<char> *)0xf < bVar9.container;
      bVar19 = uVar12 != 0;
      uVar2 = -uVar12;
      uVar12 = uVar12 >> 4;
      bVar9.container = (buffer<char> *)(uVar1 | (ulong)bVar9.container >> 4);
    } while (bVar19 || uVar2 < bVar18);
    uVar12 = size;
    if (499 < (uint)sVar17) {
      basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
      uVar12 = local_248.super_buffer<char>.size_ + size;
    }
    sVar3 = local_248.super_buffer<char>.size_;
    if ((local_248.super_buffer<char>.capacity_ < uVar12) ||
       (sVar3 = uVar12, local_248.super_buffer<char>.ptr_ == (char *)0x0)) {
      local_248.super_buffer<char>.size_ = sVar3;
      pcVar7 = (char *)((long)&local_2c8[0].prefix + sVar17);
      pcVar14 = "0123456789ABCDEF";
      if ((uVar10 >> 0xc & 1) == 0) {
        pcVar14 = "0123456789abcdef";
      }
      do {
        *pcVar7 = pcVar14[(uint)out.container & 0xf];
        uVar12 = uVar13 << 0x3c;
        pcVar7 = pcVar7 + -1;
        bVar18 = (buffer<char> *)0xf < out.container;
        bVar19 = uVar13 != 0;
        uVar1 = -uVar13;
        uVar13 = uVar13 >> 4;
        out.container = (buffer<char> *)(uVar12 | (ulong)out.container >> 4);
      } while (bVar19 || uVar1 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_2c8,(char *)((long)&local_2c8[0].prefix + sVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar7 = "0123456789ABCDEF";
      if ((uVar10 >> 0xc & 1) == 0) {
        pcVar7 = "0123456789abcdef";
      }
      pcVar14 = local_248.super_buffer<char>.ptr_ + size + local_248.super_buffer<char>.size_;
      do {
        pcVar14 = pcVar14 + -1;
        uVar1 = uVar13 << 0x3c;
        *pcVar14 = pcVar7[(uint)out.container & 0xf];
        bVar18 = (out.container < (buffer<char> *)0x10) <= uVar13;
        uVar13 = uVar13 >> 4;
        out.container = (buffer<char> *)(uVar1 | (ulong)out.container >> 4);
        local_248.super_buffer<char>.size_ = uVar12;
      } while (bVar18);
    }
    break;
  case 5:
    uVar12 = uVar13;
    bVar9.container = out.container;
    size = 0;
    do {
      sVar17 = size;
      uVar1 = uVar12 << 0x3d;
      size = sVar17 + 1;
      bVar18 = (buffer<char> *)0x7 < bVar9.container;
      bVar19 = uVar12 != 0;
      uVar2 = -uVar12;
      uVar12 = uVar12 >> 3;
      bVar9.container = (buffer<char> *)(uVar1 | (ulong)bVar9.container >> 3);
    } while (bVar19 || uVar2 < bVar18);
    if (((uVar10 >> 0xd & 1) != 0) &&
       ((out.container != (buffer<char> *)0x0 || uVar13 != 0) &&
        *(int *)((long)&(grouping->grouping_)._M_string_length + 4) <= (int)size)) {
      uVar10 = 0x3000;
      if (uVar11 == 0) {
        uVar10 = 0x30;
      }
      uVar11 = (uVar10 | uVar11) + 0x1000000;
    }
    uVar12 = size;
    if (499 < (uint)sVar17) {
      basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
      uVar12 = local_248.super_buffer<char>.size_ + size;
    }
    sVar3 = local_248.super_buffer<char>.size_;
    if ((local_248.super_buffer<char>.capacity_ < uVar12) ||
       (sVar3 = uVar12, local_248.super_buffer<char>.ptr_ == (char *)0x0)) {
      local_248.super_buffer<char>.size_ = sVar3;
      pbVar8 = (byte *)((long)&local_2c8[0].prefix + sVar17);
      do {
        *pbVar8 = (byte)out.container & 7 | 0x30;
        uVar12 = uVar13 << 0x3d;
        pbVar8 = pbVar8 + -1;
        bVar18 = (buffer<char> *)0x7 < out.container;
        bVar19 = uVar13 != 0;
        uVar1 = -uVar13;
        uVar13 = uVar13 >> 3;
        out.container = (buffer<char> *)(uVar12 | (ulong)out.container >> 3);
      } while (bVar19 || uVar1 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_2c8,(char *)((long)&local_2c8[0].prefix + sVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar7 = local_248.super_buffer<char>.ptr_ + size + local_248.super_buffer<char>.size_;
      do {
        pcVar7 = pcVar7 + -1;
        uVar1 = uVar13 << 0x3d;
        *pcVar7 = (byte)out.container & 7 | 0x30;
        bVar18 = (out.container < (buffer<char> *)0x8) <= uVar13;
        uVar13 = uVar13 >> 3;
        out.container = (buffer<char> *)(uVar1 | (ulong)out.container >> 3);
        local_248.super_buffer<char>.size_ = uVar12;
      } while (bVar18);
    }
    break;
  case 6:
    if ((uVar10 >> 0xd & 1) != 0) {
      uVar5 = (uint)((uVar10 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar10 = uVar5 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar5;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    uVar12 = uVar13;
    bVar9.container = out.container;
    size = 0;
    do {
      sVar17 = size;
      uVar1 = uVar12 << 0x3f;
      size = sVar17 + 1;
      bVar18 = (buffer<char> *)0x1 < bVar9.container;
      bVar19 = uVar12 != 0;
      uVar2 = -uVar12;
      uVar12 = uVar12 >> 1;
      bVar9.container = (buffer<char> *)(uVar1 | (ulong)bVar9.container >> 1);
    } while (bVar19 || uVar2 < bVar18);
    uVar12 = size;
    if (499 < (uint)sVar17) {
      basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
      uVar12 = local_248.super_buffer<char>.size_ + size;
    }
    sVar3 = local_248.super_buffer<char>.size_;
    if ((local_248.super_buffer<char>.capacity_ < uVar12) ||
       (sVar3 = uVar12, local_248.super_buffer<char>.ptr_ == (char *)0x0)) {
      local_248.super_buffer<char>.size_ = sVar3;
      pbVar8 = (byte *)((long)&local_2c8[0].prefix + sVar17);
      do {
        *pbVar8 = (byte)out.container & 1 | 0x30;
        uVar12 = uVar13 << 0x3f;
        pbVar8 = pbVar8 + -1;
        bVar18 = (buffer<char> *)0x1 < out.container;
        bVar19 = uVar13 != 0;
        uVar1 = -uVar13;
        uVar13 = uVar13 >> 1;
        out.container = (buffer<char> *)(uVar12 | (ulong)out.container >> 1);
      } while (bVar19 || uVar1 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_2c8,(char *)((long)&local_2c8[0].prefix + sVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar7 = local_248.super_buffer<char>.ptr_ + size + local_248.super_buffer<char>.size_;
      do {
        pcVar7 = pcVar7 + -1;
        uVar1 = uVar13 << 0x3f;
        *pcVar7 = (byte)out.container & 1 | 0x30;
        bVar18 = (out.container < (buffer<char> *)0x2) <= uVar13;
        uVar13 = uVar13 >> 1;
        out.container = (buffer<char> *)(uVar1 | (ulong)out.container >> 1);
        local_248.super_buffer<char>.size_ = uVar12;
      } while (bVar18);
    }
    break;
  case 7:
    local_2c8[0].prefix._0_2_ = CONCAT11((char)out.container,(uVar10 & 7) == 1);
    bVar9 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      ((basic_appender<char>)this,(format_specs *)grouping,1,1,
                       (anon_class_2_2_bf5026b7 *)local_2c8);
    goto LAB_0021158a;
  default:
    n._12_4_ = uVar11;
    n._0_12_ = in_stack_fffffffffffffd18;
    uVar10 = uVar11;
    uVar5 = count_digits_fallback<unsigned__int128>((detail *)out.container,(unsigned___int128)n);
    size = (size_t)uVar5;
    value_00._12_4_ = uVar10;
    value_00._0_12_ = in_stack_fffffffffffffd18;
    format_decimal<char,_unsigned___int128,_fmt::v11::basic_appender<char>,_0>
              ((detail *)&local_248,out,(unsigned___int128)value_00,prefix);
  }
  if (in_R9[5] != 0) {
    pcVar7 = (char *)*in_R9;
    pcVar14 = pcVar7 + in_R9[1];
    iVar6 = 0;
    iVar15 = 0;
    do {
      if (pcVar7 == pcVar14) {
        cVar16 = pcVar14[-1];
        pcVar7 = pcVar14;
      }
      else {
        cVar16 = *pcVar7;
        if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_00211555;
        pcVar7 = pcVar7 + 1;
      }
      iVar15 = iVar15 + cVar16;
      if ((int)size <= iVar15) goto LAB_00211555;
      iVar6 = iVar6 + 1;
    } while( true );
  }
  iVar6 = 0;
LAB_00211555:
  uVar13 = (ulong)((uVar11 >> 0x18) + (int)size + iVar6);
  local_2c8[0].prefix = (uint *)&stack0xfffffffffffffd24;
  local_2c8[0].buffer = &local_248;
  bVar9 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,(format_specs *)grouping,uVar13,uVar13,local_2c8);
LAB_0021158a:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    free(local_248.super_buffer<char>.ptr_);
  }
  return (basic_appender<char>)bVar9.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}